

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O2

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createFree(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  Use *pUVar1;
  PSNode *pPVar2;
  PSNode *op1;
  PSNode *local_10;
  
  pUVar1 = llvm::User::getOperandList((User *)Inst);
  local_10 = getOperand(this,*(Value **)pUVar1);
  pPVar2 = PointerGraph::create<(dg::pta::PSNodeType)16,dg::pta::PSNode*&>
                     ((PointerGraph *)this,&local_10);
  return pPVar2;
}

Assistant:

PSNode *LLVMPointerGraphBuilder::createFree(const llvm::Instruction *Inst) {
    PSNode *op1 = getOperand(Inst->getOperand(0));
    PSNode *node = PS.create<PSNodeType::FREE>(op1);

    return node;
}